

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

void __thiscall higan::Thread::Thread(Thread *this,string *name,ThreadFunc *function)

{
  pointer pcVar1;
  
  (this->name_)._M_dataplus._M_p = (pointer)&(this->name_).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  this->thread_ = 0;
  std::function<void_()>::function(&this->function_,function);
  this->started = false;
  this->joined = false;
  return;
}

Assistant:

Thread::Thread(const std::string& name, const ThreadFunc& function):
		name_(name),
		thread_(),
		function_(function),
		started(false),
		joined(false)
{

}